

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcTextLiteralWithExtent::~IfcTextLiteralWithExtent
          (IfcTextLiteralWithExtent *this)

{
  _func_int *p_Var1;
  char *pcVar2;
  _func_int *p_Var3;
  
  p_Var3 = (this->super_IfcTextLiteral).super_IfcGeometricRepresentationItem.
           super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcTextLiteral).super_IfcGeometricRepresentationItem.
                   super_IfcRepresentationItem.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                   _vptr_ObjectHelper + (long)p_Var3);
  pcVar2 = (this->BoxAlignment).field_2._M_local_buf + (long)p_Var3;
  pcVar2[-0xa8] = -0x40;
  pcVar2[-0xa7] = -0x76;
  pcVar2[-0xa6] = -0x76;
  pcVar2[-0xa5] = '\0';
  pcVar2[-0xa4] = '\0';
  pcVar2[-0xa3] = '\0';
  pcVar2[-0xa2] = '\0';
  pcVar2[-0xa1] = '\0';
  pcVar2[0x10] = '`';
  pcVar2[0x11] = -0x75;
  pcVar2[0x12] = -0x76;
  pcVar2[0x13] = '\0';
  pcVar2[0x14] = '\0';
  pcVar2[0x15] = '\0';
  pcVar2[0x16] = '\0';
  pcVar2[0x17] = '\0';
  pcVar2[-0x98] = -0x18;
  pcVar2[-0x97] = -0x76;
  pcVar2[-0x96] = -0x76;
  pcVar2[-0x95] = '\0';
  pcVar2[-0x94] = '\0';
  pcVar2[-0x93] = '\0';
  pcVar2[-0x92] = '\0';
  pcVar2[-0x91] = '\0';
  pcVar2[-0x88] = '\x10';
  pcVar2[-0x87] = -0x75;
  pcVar2[-0x86] = -0x76;
  pcVar2[-0x85] = '\0';
  pcVar2[-0x84] = '\0';
  pcVar2[-0x83] = '\0';
  pcVar2[-0x82] = '\0';
  pcVar2[-0x81] = '\0';
  pcVar2[-0x28] = '8';
  pcVar2[-0x27] = -0x75;
  pcVar2[-0x26] = -0x76;
  pcVar2[-0x25] = '\0';
  pcVar2[-0x24] = '\0';
  pcVar2[-0x23] = '\0';
  pcVar2[-0x22] = '\0';
  pcVar2[-0x21] = '\0';
  if (*(char **)(pcVar2 + -0x10) != pcVar2) {
    operator_delete(*(char **)(pcVar2 + -0x10));
  }
  *(undefined8 *)p_Var1 = 0x8a8c38;
  *(undefined8 *)(p_Var1 + 0xb8) = 0x8a8cb0;
  *(undefined8 *)(p_Var1 + 0x10) = 0x8a8c60;
  *(undefined8 *)(p_Var1 + 0x20) = 0x8a8c88;
  if (*(code **)(p_Var1 + 0x60) != p_Var1 + 0x70) {
    operator_delete(*(code **)(p_Var1 + 0x60));
  }
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 0x58) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var1 + 0x58));
  }
  if (*(code **)(p_Var1 + 0x30) != p_Var1 + 0x40) {
    operator_delete(*(code **)(p_Var1 + 0x30));
  }
  operator_delete(p_Var1);
  return;
}

Assistant:

IfcTextLiteralWithExtent() : Object("IfcTextLiteralWithExtent") {}